

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

int __thiscall Node::OutputPrintData(Node *this,ostream *os,int InputFlag)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  undefined1 local_48 [44];
  int TestFlag;
  int ReturnFlag;
  int InputFlag_local;
  ostream *os_local;
  Node *this_local;
  
  local_48._36_4_ = 0;
  iVar1 = this->Type;
  if (iVar1 == 0x23) {
    local_48._40_4_ = 2;
    IOChannel = this;
  }
  else {
    TestFlag = InputFlag;
    _ReturnFlag = (Node *)os;
    os_local = (ostream *)this;
    if (iVar1 == 0x1b1) {
      IOUsing = this->Tree[0];
      local_48._40_4_ = 2;
      Indent_abi_cxx11_((Node *)local_48);
      poVar3 = std::operator<<(os,(string *)local_48);
      poVar3 = std::operator<<(poVar3,"PUse.SetFormat(");
      Expression_abi_cxx11_((Node *)local_78);
      poVar3 = std::operator<<(poVar3,(string *)local_78);
      poVar3 = std::operator<<(poVar3,");");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)local_48);
    }
    else if (iVar1 == 0x1d4) {
      OutputIPChannel(this,os,0);
      if (IOUsing == (Node *)0x0) {
        poVar3 = std::operator<<((ostream *)_ReturnFlag," << ");
        Expression_abi_cxx11_((Node *)local_d8);
        std::operator<<(poVar3,(string *)local_d8);
        std::__cxx11::string::~string((string *)local_d8);
      }
      else {
        poVar3 = std::operator<<((ostream *)_ReturnFlag," << PUse.Output(");
        Expression_abi_cxx11_((Node *)local_b8);
        poVar3 = std::operator<<(poVar3,(string *)local_b8);
        poVar3 = std::operator<<(poVar3,");");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_b8);
        IOChPrinted = 0;
      }
      local_48._40_4_ = 1;
    }
    else if (iVar1 == 0x1f5) {
      if (this->Tree[0] != (Node *)0x0) {
        local_48._36_4_ = OutputPrintData(this->Tree[0],os,InputFlag);
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->TextValue);
      if (((*pcVar2 == ',') && (local_48._36_4_ != 2)) && (IOUsing == (Node *)0x0)) {
        OutputIPChannel(this,(ostream *)_ReturnFlag,TestFlag);
        std::operator<<((ostream *)_ReturnFlag," << \'\\t\'");
      }
      if (this->Tree[1] == (Node *)0x0) {
        local_48._40_4_ = 0;
      }
      else {
        local_48._40_4_ = OutputPrintData(this->Tree[1],(ostream *)_ReturnFlag,TestFlag);
      }
    }
    else if (iVar1 == 0x206) {
      OutputIPChannel(this,os,InputFlag);
      poVar3 = std::operator<<((ostream *)_ReturnFlag," << RECORD(");
      Expression_abi_cxx11_((Node *)local_98);
      poVar3 = std::operator<<(poVar3,(string *)local_98);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)local_98);
      local_48._40_4_ = 2;
    }
    else {
      iVar1 = CheckCpos(this);
      if (iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)_ReturnFlag,";");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        IOChPrinted = 0;
      }
      OutputIPChannel(this,(ostream *)_ReturnFlag,TestFlag);
      if (IOUsing == (Node *)0x0) {
        iVar1 = IsNumber(this);
        if (iVar1 == 0) {
          poVar3 = std::operator<<((ostream *)_ReturnFlag," << ");
          Expression_abi_cxx11_((Node *)local_138);
          std::operator<<(poVar3,(string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
        }
        else {
          poVar3 = std::operator<<((ostream *)_ReturnFlag," << \' \'");
          poVar3 = std::operator<<(poVar3," << ");
          Expression_abi_cxx11_((Node *)local_118);
          poVar3 = std::operator<<(poVar3,(string *)local_118);
          std::operator<<(poVar3," << \' \'");
          std::__cxx11::string::~string((string *)local_118);
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)_ReturnFlag," << PUse.Output(");
        Expression_abi_cxx11_((Node *)local_f8);
        poVar3 = std::operator<<(poVar3,(string *)local_f8);
        poVar3 = std::operator<<(poVar3,");");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_f8);
        IOChPrinted = 0;
      }
      local_48._40_4_ = 1;
    }
  }
  return local_48._40_4_;
}

Assistant:

int Node::OutputPrintData(
	std::ostream& os,	/**< Channel to write C++ code to */
	int InputFlag		/**< Specifies if it is working on 
				 * an input statement, ie. specifies the 
				 * direction of the arrows. 
				 */
)
{
	int ReturnFlag;		// Does a return seem to be needed
				//   Gets set to one if the print/Input command
				//   ends with a ',' or ';'.
	int TestFlag = 0;	// Test for special item

	//
	// Is this a piece of a list?
	//
	switch (Type)
	{
	case BAS_N_LIST:
		//
		// Try the left side of the tree
		//
		if (Tree[0] != 0)
		{
			TestFlag = Tree[0]->OutputPrintData(os, InputFlag);
		}

		//
		// Do we need to append a tab between fields?
		// Only do so for print statements.
		//
		if ((TextValue[0] == ',') &&
			(TestFlag != 2) && (IOUsing == 0))
		{
			OutputIPChannel(os, InputFlag);
			os << " << '\\t'";
		}

		//
		// Handle right side of the tree
		//
		if (Tree[1] != 0)
		{
			ReturnFlag = Tree[1]->OutputPrintData(os, InputFlag);
		}
		else
		{
			ReturnFlag = 0;
		}

		break;

	case '#':
		IOChannel = this;
		ReturnFlag = 2;
		break;

	case BAS_S_USING:
		IOUsing = Tree[0];
		ReturnFlag = 2;

		os << Indent() << "PUse.SetFormat(" << IOUsing->Expression() <<
			");" << std::endl;

		break;

	case BAS_N_RECORD:
		OutputIPChannel(os, InputFlag);
		os << " << RECORD(" << Tree[0]->Expression() << ")";
		ReturnFlag = 2;
		break;

	case BAS_V_TEXTSTRING:
		OutputIPChannel(os, 0);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			os << " << " << Expression();
		}
		ReturnFlag = 1;

		break;


	default:


		//
		// Print
		//
		if (CheckCpos())
		{
			//
			// If we have an item that needs the current
			// cursor position to be correct, we have to put
			// it at tyhe beginning of an output statement
			//
			os << ";" << std::endl;
			IOChPrinted = 0;
		}

		OutputIPChannel(os, InputFlag);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			if (IsNumber() != 0)
			{
				//
				// Basic puts either a '-' or a ' ' in front
				// of numbers, and as ' ' after the number.
				//
				// \note we are assuming positive numbers only,
				// because dealing with negitive ones gets ug;y
				// really fast.
				//
				os << " << ' '" <<
					" << " << Expression() <<
					" << ' '";
			}
			else
			{
				os << " << " << Expression();
			}
		}
		ReturnFlag = 1;
		break;
	}

	//
	// Done
	//
	return ReturnFlag;
}